

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_arc.cxx
# Opt level: O3

void __thiscall
Fl_Graphics_Driver::arc(Fl_Graphics_Driver *this,double x,double y,double r,double start,double end)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  double local_58;
  
  dVar2 = start * 0.017453292519943295;
  dVar3 = cos(dVar2);
  local_58 = sin(dVar2);
  local_58 = local_58 * -r;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(dVar3 * r + x);
  dVar4 = transform_dx(fl_graphics_driver,r,0.0);
  dVar5 = transform_dy(fl_graphics_driver,r,0.0);
  dVar6 = transform_dx(fl_graphics_driver,0.0,r);
  dVar7 = transform_dy(fl_graphics_driver,0.0,r);
  auVar8._0_8_ = dVar4 * dVar4 + dVar5 * dVar5;
  auVar8._8_8_ = dVar6 * dVar6 + dVar7 * dVar7;
  auVar8 = sqrtpd(auVar8,auVar8);
  uVar9 = auVar8._8_4_;
  uVar10 = auVar8._12_4_;
  if (auVar8._0_8_ <= auVar8._8_8_) {
    uVar9 = auVar8._0_4_;
    uVar10 = auVar8._4_4_;
  }
  dVar4 = 2.0;
  if (2.0 <= (double)CONCAT44(uVar10,uVar9)) {
    dVar4 = (double)CONCAT44(uVar10,uVar9);
  }
  dVar4 = acos(-0.125 / dVar4 + 1.0);
  dVar2 = end * 0.017453292519943295 - dVar2;
  dVar4 = ceil(ABS(dVar2) / (dVar4 + dVar4));
  iVar1 = (int)dVar4;
  if (iVar1 != 0) {
    dVar2 = dVar2 / (double)iVar1;
    dVar4 = cos(dVar2);
    dVar5 = sin(dVar2);
    dVar3 = dVar3 * r;
    do {
      dVar6 = dVar4 * dVar3 + dVar5 * local_58;
      local_58 = local_58 * dVar4 + dVar3 * -dVar5;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                (dVar6 + x,SUB84(local_58 + y,0));
      iVar1 = iVar1 + -1;
      dVar3 = dVar6;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::arc(double x, double y, double r, double start, double end) {

  // draw start point accurately:
  
  double A = start*(M_PI/180);		// Initial angle (radians)
  double X =  r*cos(A);			// Initial displacement, (X,Y)
  double Y = -r*sin(A);			//   from center to initial point
  fl_vertex(x+X,y+Y);			// Insert initial point

  // Maximum arc length to approximate with chord with error <= 0.125
  
  double epsilon; {
    double r1 = _fl_hypot(fl_transform_dx(r,0), // Horizontal "radius"
		          fl_transform_dy(r,0));
    double r2 = _fl_hypot(fl_transform_dx(0,r), // Vertical "radius"
		          fl_transform_dy(0,r));
		      
    if (r1 > r2) r1 = r2;		// r1 = minimum "radius"
    if (r1 < 2.) r1 = 2.;		// radius for circa 9 chords/circle
    
    epsilon = 2*acos(1.0 - 0.125/r1);	// Maximum arc angle
  }
  A = end*(M_PI/180) - A;		// Displacement angle (radians)
  int i = int(ceil(fabs(A)/epsilon));	// Segments in approximation
  
  if (i) {
    epsilon = A/i;			// Arc length for equal-size steps
    double cos_e = cos(epsilon);	// Rotation coefficients
    double sin_e = sin(epsilon);
    do {
      double Xnew =  cos_e*X + sin_e*Y;
		Y = -sin_e*X + cos_e*Y;
      fl_vertex(x + (X=Xnew), y + Y);
    } while (--i);
  }
}